

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsSecondPartialDerivativeWRTControlSparsity
          (OptimalControlProblem *this,SparsityStructure *controlSparsity)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  element_type *peVar4;
  size_t numberOfColumns;
  char *pcVar5;
  long *in_RDI;
  ostringstream errorMsg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>
  *costPtr;
  iterator __end3;
  iterator __begin3;
  CostsMap *__range3;
  iterator cost;
  bool allHaveSparsity;
  SparsityStructure *in_stack_fffffffffffffdc8;
  SparsityStructure *in_stack_fffffffffffffdd0;
  ostringstream *this_00;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
  *in_stack_fffffffffffffdd8;
  SparsityStructure *in_stack_fffffffffffffde0;
  SparsityStructure *in_stack_fffffffffffffde8;
  undefined6 in_stack_fffffffffffffdf0;
  byte in_stack_fffffffffffffdf6;
  undefined1 uVar6;
  SparsityStructure *in_stack_fffffffffffffe00;
  ostringstream local_1d0 [376];
  reference local_58;
  _Self local_50;
  _Self local_48;
  long local_40;
  _Base_ptr local_38;
  _Self local_30;
  _Self local_28;
  byte local_19;
  byte local_1;
  
  local_19 = 1;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
                *)in_stack_fffffffffffffdc8);
  while( true ) {
    uVar6 = false;
    if ((local_19 & 1) != 0) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
                  *)in_stack_fffffffffffffdc8);
      uVar6 = std::operator!=(&local_28,&local_30);
    }
    if ((bool)uVar6 == false) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                  *)0x2ff69c);
    in_stack_fffffffffffffde8 =
         (SparsityStructure *)
         std::
         __shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ff6a8);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                           *)0x2ff6ba);
    iVar2 = (*(code *)(in_stack_fffffffffffffde8->m_register)._M_h._M_buckets[10])
                      (in_stack_fffffffffffffde8,&(ppVar3->second).controlHessianSparsity);
    in_stack_fffffffffffffdf6 = (byte)iVar2;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                           *)0x2ff6e4);
    (ppVar3->second).hasControlHessianSparsity = (bool)(in_stack_fffffffffffffdf6 & 1);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                           *)0x2ff6fe);
    local_19 = (local_19 & 1 & (ppVar3->second).hasControlHessianSparsity & 1U) != 0;
    local_38 = (_Base_ptr)
               std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
               ::operator++(in_stack_fffffffffffffdd8,
                            (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
  }
  if ((local_19 & 1) == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(*in_RDI + 0x18));
    if (!bVar1) {
      this_00 = local_1d0;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "Not all costs have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown."
                     );
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError
                ("OptimalControlProblem","costsSecondPartialDerivativeWRTControlSparsity",pcVar5);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1d0);
      goto LAB_002ff96f;
    }
    SparsityStructure::clear(in_stack_fffffffffffffdd0);
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ff85b);
    numberOfColumns = DynamicalSystem::controlSpaceSize(peVar4);
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ff87c);
    DynamicalSystem::controlSpaceSize(peVar4);
    SparsityStructure::addDenseBlock
              (in_stack_fffffffffffffe00,(size_t)in_RDI,
               CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
               (size_t)in_stack_fffffffffffffde8,numberOfColumns);
  }
  else {
    SparsityStructure::clear(in_stack_fffffffffffffdd0);
    local_40 = *in_RDI + 0x58;
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
                  *)in_stack_fffffffffffffdc8);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
                *)in_stack_fffffffffffffdc8);
    while (bVar1 = std::operator!=(&local_48,&local_50), bVar1) {
      local_58 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                              *)0x2ff7ca);
      SparsityStructure::merge(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                    *)in_stack_fffffffffffffdd0);
    }
  }
  SparsityStructure::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_1 = 1;
LAB_002ff96f:
  return (bool)(local_1 & 1);
}

Assistant:

bool OptimalControlProblem::costsSecondPartialDerivativeWRTControlSparsity(SparsityStructure &controlSparsity)
        {
            bool allHaveSparsity = true;

            auto cost = m_pimpl->costs.begin();

            while (allHaveSparsity && cost != m_pimpl->costs.end()) {
                cost->second.hasControlHessianSparsity =
                    cost->second.cost->costSecondPartialDerivativeWRTControlSparsity(cost->second.controlHessianSparsity);
                allHaveSparsity &= cost->second.hasControlHessianSparsity;
                cost++;
            }

            if (allHaveSparsity) {
                m_pimpl->costsControlHessianSparsity.clear();

                for (auto& costPtr : m_pimpl->costs) {
                    m_pimpl->costsControlHessianSparsity.merge(costPtr.second.controlHessianSparsity);
                }

            } else {
                if (m_pimpl->dynamicalSystem) {
                    m_pimpl->costsControlHessianSparsity.clear();
                    m_pimpl->costsControlHessianSparsity.addDenseBlock(0, 0, m_pimpl->dynamicalSystem->controlSpaceSize(), m_pimpl->dynamicalSystem->controlSpaceSize());
                } else {
                    std::ostringstream errorMsg;
                    errorMsg << "Not all costs have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown.";
                    reportError("OptimalControlProblem", "costsSecondPartialDerivativeWRTControlSparsity", errorMsg.str().c_str());
                    return false;
                }
            }

            controlSparsity = m_pimpl->costsControlHessianSparsity;
            return true;
        }